

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

void learn(log_multi *b,single_learner *base,example *ec)

{
  uint32_t *puVar1;
  node *pnVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t in_R9D;
  uint32_t label;
  uint32_t cn;
  uint32_t class_index;
  uint32_t local_44;
  float local_40;
  float local_3c;
  uint32_t local_38;
  uint32_t local_34;
  
  if (((ec->l).multi.label == 0xffffffff) || (b->progress == true)) {
    predict(b,base,ec);
  }
  label = (ec->l).multi.label;
  if (label != 0xffffffff) {
    local_3c = (ec->l).simple.weight;
    local_40 = (ec->pred).scalar;
    uVar7 = 0;
    local_34 = 0;
    (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
    (ec->l).simple.initial = 0.0;
    local_44 = 0;
    bVar3 = children(b,&local_44,&local_34,label);
    local_38 = label;
    if (bVar3) {
      do {
        train_node(b,base,ec,&local_44,&local_34,in_R9D);
        label = local_38;
        uVar7 = (&(b->nodes)._begin[uVar7].left)
                [0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
        local_44 = uVar7;
        bVar3 = children(b,&local_44,&local_34,local_38);
      } while (bVar3);
    }
    uVar4 = (ulong)local_44;
    puVar1 = &(b->nodes)._begin[uVar4].min_count;
    *puVar1 = *puVar1 + 1;
    if (uVar4 != 0) {
      do {
        pnVar2 = (b->nodes)._begin;
        uVar7 = pnVar2[uVar4].parent;
        uVar5 = (ulong)uVar7;
        if (pnVar2[uVar5].min_count == pnVar2[uVar4].min_count) break;
        uVar6 = pnVar2[pnVar2[uVar5].left].min_count;
        if (pnVar2[pnVar2[uVar5].right].min_count < pnVar2[pnVar2[uVar5].left].min_count) {
          uVar6 = pnVar2[pnVar2[uVar5].right].min_count;
        }
        pnVar2[uVar5].min_count = uVar6;
        uVar4 = uVar5;
      } while (uVar7 != 0);
    }
    (ec->pred).scalar = local_40;
    (ec->l).multi.label = label;
    (ec->l).simple.weight = local_3c;
  }
  return;
}

Assistant:

void learn(log_multi& b, single_learner& base, example& ec)
{
  //    verify_min_dfs(b, b.nodes[0]);
  if (ec.l.multi.label == (uint32_t)-1 || b.progress)
    predict(b, base, ec);

  if (ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    MULTICLASS::label_t mc = ec.l.multi;
    uint32_t start_pred = ec.pred.multiclass;

    uint32_t class_index = 0;
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    uint32_t cn = 0;
    uint32_t depth = 0;
    while (children(b, cn, class_index, mc.label))
    {
      train_node(b, base, ec, cn, class_index, depth);
      cn = descend(b.nodes[cn], ec.pred.scalar);
      depth++;
    }

    b.nodes[cn].min_count++;
    update_min_count(b, cn);
    ec.pred.multiclass = start_pred;
    ec.l.multi = mc;
  }
}